

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string *key)

{
  bool bVar1;
  undefined8 in_RSI;
  string *in_RDI;
  Symbol SVar2;
  Symbol result;
  Symbol local_28;
  void *in_stack_fffffffffffffff8;
  
  SVar2 = FileDescriptorTables::FindNestedSymbolOfType
                    ((FileDescriptorTables *)result._0_8_,in_stack_fffffffffffffff8,in_RDI,
                     (Type)((ulong)in_RSI >> 0x20));
  local_28.field_1 = SVar2.field_1;
  local_28.type = SVar2.type;
  bVar1 = Symbol::IsNull(&local_28);
  if ((bVar1) || (bVar1 = FieldDescriptor::is_extension(local_28.field_1.field_descriptor), !bVar1))
  {
    local_28.field_1.descriptor = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)local_28.field_1.descriptor;
}

Assistant:

const FieldDescriptor* FileDescriptor::FindExtensionByName(
    const std::string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return nullptr;
  }
}